

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

type __thiscall
chrono::ChValueSpecific<double>::_get_name_string<double>(ChValueSpecific<double> *this)

{
  int iVar1;
  allocator local_9;
  
  if (_get_name_string<double>()::nostring_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&_get_name_string<double>()::nostring_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&_get_name_string<double>()::nostring_abi_cxx11_,"",&local_9);
      __cxa_atexit(std::__cxx11::string::~string,&_get_name_string<double>()::nostring_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&_get_name_string<double>()::nostring_abi_cxx11_);
    }
  }
  return &_get_name_string<double>()::nostring_abi_cxx11_;
}

Assistant:

typename enable_if< !ChDetect_ArchiveContainerName<Tc>::value, std::string& >::type 
        _get_name_string() {
            static std::string nostring(""); 
            return nostring; // nothing to do if not provided
        }